

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_wString __thiscall
ON_Font::Description
          (ON_Font *this,NameLocale name_local,wchar_t family_separator,
          wchar_t weight_width_slope_separator,bool bIncludeUndelinedAndStrikethrough,
          bool bIncludeNotOnDevice)

{
  bool bVar1;
  undefined7 in_register_00000031;
  ON_Font *this_00;
  undefined3 in_register_00000081;
  byte in_stack_00000008;
  ON_wString local_a8;
  ON_wString local_a0;
  ON_wString local_98;
  undefined1 local_8a;
  byte local_89;
  undefined1 local_88 [6];
  bool bStrikethrough;
  bool bUnderlined;
  undefined1 local_80 [8];
  ON_wString postscript_name;
  ON_wString face_name;
  ON_wString local_60;
  undefined1 local_58 [8];
  ON_wString wws;
  ON_wString logfont_name;
  ON_wString family_name;
  ON_wString local_30;
  byte local_27;
  byte local_26;
  undefined1 local_25;
  undefined4 local_24;
  bool bIncludeNotOnDevice_local;
  wchar_t wStack_20;
  bool bIncludeUndelinedAndStrikethrough_local;
  wchar_t weight_width_slope_separator_local;
  wchar_t family_separator_local;
  NameLocale name_local_local;
  ON_Font *this_local;
  ON_wString *description;
  
  local_24 = CONCAT31(in_register_00000081,bIncludeUndelinedAndStrikethrough);
  this_00 = (ON_Font *)CONCAT71(in_register_00000031,name_local);
  weight_width_slope_separator_local._3_1_ = (undefined1)family_separator;
  local_26 = in_stack_00000008 & 1;
  local_27 = 0;
  local_25 = bIncludeNotOnDevice;
  wStack_20 = weight_width_slope_separator;
  _family_separator_local = (wchar_t *)this_00;
  this_local = this;
  ON_wString::ON_wString((ON_wString *)this);
  if (((local_26 & 1) != 0) && (bVar1 = IsManagedSubstitutedFont(this_00), bVar1)) {
    ON_wString::ON_wString(&local_30,L"[Not on device] ");
    ON_wString::operator+=((ON_wString *)this,&local_30);
    ON_wString::~ON_wString(&local_30);
  }
  FamilyName((ON_Font *)&logfont_name);
  ON_wString::TrimLeftAndRight(&logfont_name,(wchar_t *)0x0);
  WindowsLogfontName((ON_Font *)&wws);
  ON_wString::TrimLeftAndRight(&wws,(wchar_t *)0x0);
  bVar1 = ON_wString::IsEmpty(&logfont_name);
  if ((bVar1) && (bVar1 = ON_wString::IsNotEmpty(&wws), bVar1)) {
    ON_wString::operator+=((ON_wString *)this,&wws);
    WidthWeightSlantDescription((ON_Font *)local_58);
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)local_58);
    if (bVar1) {
      ON_wString::ON_wString(&local_60,L" (");
      ON_wString::operator+=((ON_wString *)this,&local_60);
      ON_wString::~ON_wString(&local_60);
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)local_58);
      ON_wString::ON_wString(&face_name,L")");
      ON_wString::operator+=((ON_wString *)this,&face_name);
      ON_wString::~ON_wString(&face_name);
    }
    ON_wString::~ON_wString((ON_wString *)local_58);
  }
  else {
    bVar1 = ON_wString::IsNotEmpty(&logfont_name);
    if (bVar1) {
      ON_wString::operator+=((ON_wString *)this,&logfont_name);
      FaceName((ON_Font *)&stack0xffffffffffffff90);
      ON_wString::TrimLeftAndRight((ON_wString *)&stack0xffffffffffffff90,(wchar_t *)0x0);
      bVar1 = ON_wString::IsNotEmpty((ON_wString *)&stack0xffffffffffffff90);
      if (bVar1) {
        ON_wString::ON_wString(&postscript_name,L" ");
        ON_wString::operator+=((ON_wString *)this,&postscript_name);
        ON_wString::~ON_wString(&postscript_name);
        ON_wString::operator+=((ON_wString *)this,(ON_wString *)&stack0xffffffffffffff90);
      }
      ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff90);
    }
    else {
      PostScriptName((ON_Font *)local_80);
      ON_wString::TrimLeftAndRight((ON_wString *)local_80,(wchar_t *)0x0);
      bVar1 = ON_wString::IsNotEmpty((ON_wString *)local_80);
      if (bVar1) {
        ON_wString::operator+=((ON_wString *)this,(ON_wString *)local_80);
      }
      ON_wString::~ON_wString((ON_wString *)local_80);
    }
  }
  bVar1 = ON_wString::IsEmpty((ON_wString *)this);
  if (bVar1) {
    WidthWeightSlantDescription((ON_Font *)local_88);
    ON_wString::operator=((ON_wString *)this,(ON_wString *)local_88);
    ON_wString::~ON_wString((ON_wString *)local_88);
  }
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)this);
  if (bVar1) {
    local_89 = IsUnderlined(this_00);
    local_8a = IsStrikethrough(this_00);
    if (((local_89 & 1) == 0) || (!(bool)local_8a)) {
      if ((local_89 & 1) == 0) {
        if ((bool)local_8a) {
          ON_wString::ON_wString(&local_a8,L" (strikethrough)");
          ON_wString::operator+=((ON_wString *)this,&local_a8);
          ON_wString::~ON_wString(&local_a8);
        }
      }
      else {
        ON_wString::ON_wString(&local_a0,L" (underlined)");
        ON_wString::operator+=((ON_wString *)this,&local_a0);
        ON_wString::~ON_wString(&local_a0);
      }
    }
    else {
      ON_wString::ON_wString(&local_98,L" (underlined,strikethrough)");
      ON_wString::operator+=((ON_wString *)this,&local_98);
      ON_wString::~ON_wString(&local_98);
    }
  }
  local_27 = 1;
  ON_wString::~ON_wString(&wws);
  ON_wString::~ON_wString(&logfont_name);
  if ((local_27 & 1) == 0) {
    ON_wString::~ON_wString((ON_wString *)this);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_Font::Description(
  ON_Font::NameLocale name_local,
  wchar_t family_separator,
  wchar_t weight_width_slope_separator,
  bool bIncludeUndelinedAndStrikethrough,
  bool bIncludeNotOnDevice
) const
{
  ON_wString description;

  if (bIncludeNotOnDevice && this->IsManagedSubstitutedFont())
  {
    description += ON_wString(L"[Not on device] ");
  }

  ON_wString family_name = FamilyName();
  family_name.TrimLeftAndRight();
  ON_wString logfont_name = WindowsLogfontName();
  logfont_name.TrimLeftAndRight();
  if (family_name.IsEmpty() && logfont_name.IsNotEmpty())
  {
    // LOGFONT (width-weight-slant)
    description += logfont_name;

    const ON_wString wws = this->WidthWeightSlantDescription();
    if (wws.IsNotEmpty())
    {
      description += ON_wString(L" (");
      description += wws;
      description += ON_wString(L")");
    }
  }
  else if (family_name.IsNotEmpty() )
  {
    // family face
    description += family_name;
    ON_wString face_name = FaceName();
    face_name.TrimLeftAndRight();
    if ( face_name.IsNotEmpty() )
    {
      description += ON_wString(L" ");
      description += face_name;
    }
  }
  else
  {
    ON_wString postscript_name = PostScriptName();
    postscript_name.TrimLeftAndRight();
    if (postscript_name.IsNotEmpty())
      description += postscript_name;
  }

  if (description.IsEmpty())
    description = this->WidthWeightSlantDescription();

  if (description.IsNotEmpty())
  {
    const bool bUnderlined = IsUnderlined();
    const bool bStrikethrough = IsStrikethrough();
    if (bUnderlined && bStrikethrough)
      description += ON_wString(L" (underlined,strikethrough)");
    else if (bUnderlined)
      description += ON_wString(L" (underlined)");
    else if (bStrikethrough)
      description += ON_wString(L" (strikethrough)");
  }

  return description;
}